

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Client_call(UA_Client *client,UA_NodeId objectId,UA_NodeId methodId,size_t inputSize,
              UA_Variant *input,size_t *outputSize,UA_Variant **output)

{
  UA_CallRequest request_00;
  UA_StatusCode local_1a4;
  undefined1 local_1a0 [4];
  UA_StatusCode retval;
  UA_CallResponse response;
  UA_CallMethodRequest item;
  UA_CallRequest request;
  UA_Variant **output_local;
  size_t *outputSize_local;
  UA_Variant *input_local;
  size_t inputSize_local;
  UA_Client *client_local;
  
  UA_CallRequest_init((UA_CallRequest *)&item.inputArguments);
  UA_CallMethodRequest_init((UA_CallMethodRequest *)&response.diagnosticInfos);
  item.objectId.identifier.string.data = (UA_Byte *)methodId._0_8_;
  item.methodId._0_8_ = methodId.identifier.string.length;
  item.methodId.identifier.string.length = (size_t)methodId.identifier.string.data;
  response.diagnosticInfos = (UA_DiagnosticInfo *)objectId._0_8_;
  item.objectId._0_8_ = objectId.identifier.string.length;
  item.objectId.identifier.string.length = (size_t)objectId.identifier.string.data;
  request_00.requestHeader.authenticationToken.identifier.string.length =
       request.requestHeader.authenticationToken._0_8_;
  request_00.requestHeader.authenticationToken._0_8_ = item.inputArguments;
  request_00.requestHeader.authenticationToken.identifier.string.data =
       (UA_Byte *)request.requestHeader.authenticationToken.identifier.string.length;
  request_00.requestHeader.timestamp =
       (UA_DateTime)request.requestHeader.authenticationToken.identifier.string.data;
  request_00.requestHeader._32_8_ = request.requestHeader.timestamp;
  request_00.requestHeader.auditEntryId.length = request.requestHeader._32_8_;
  request_00.requestHeader.auditEntryId.data = (UA_Byte *)request.requestHeader.auditEntryId.length;
  request_00.requestHeader._56_8_ = request.requestHeader.auditEntryId.data;
  request_00.requestHeader.additionalHeader._0_8_ = request.requestHeader._56_8_;
  request_00.requestHeader.additionalHeader.content.decoded.type =
       (UA_DataType *)request.requestHeader.additionalHeader._0_8_;
  request_00.requestHeader.additionalHeader.content.decoded.data =
       request.requestHeader.additionalHeader.content.decoded.type;
  request_00.requestHeader.additionalHeader.content._16_8_ =
       request.requestHeader.additionalHeader.content.decoded.data;
  request_00.requestHeader.additionalHeader.content.encoded.body.length =
       request.requestHeader.additionalHeader.content._16_8_;
  request_00.requestHeader.additionalHeader.content.encoded.body.data =
       (UA_Byte *)request.requestHeader.additionalHeader.content.encoded.body.length;
  request_00.methodsToCallSize = 1;
  request_00.methodsToCall = (UA_CallMethodRequest *)&response.diagnosticInfos;
  item.methodId.identifier.string.data = (UA_Byte *)inputSize;
  item.inputArgumentsSize = (size_t)input;
  UA_Client_Service_call((UA_CallResponse *)local_1a0,client,request_00);
  local_1a4 = response.responseHeader.timestamp._4_4_;
  if (response.responseHeader.timestamp._4_4_ == 0) {
    if (response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1) {
      local_1a4 = *(UA_StatusCode *)response.resultsSize;
    }
    else {
      local_1a4 = 0x80010000;
    }
  }
  if (local_1a4 == 0) {
    if ((output != (UA_Variant **)0x0) && (outputSize != (size_t *)0x0)) {
      *output = *(UA_Variant **)(response.resultsSize + 0x30);
      *outputSize = *(size_t *)(response.resultsSize + 0x28);
      *(undefined8 *)(response.resultsSize + 0x30) = 0;
      *(undefined8 *)(response.resultsSize + 0x28) = 0;
    }
    UA_CallResponse_deleteMembers((UA_CallResponse *)local_1a0);
  }
  else {
    UA_CallResponse_deleteMembers((UA_CallResponse *)local_1a0);
  }
  return local_1a4;
}

Assistant:

UA_StatusCode
UA_Client_call(UA_Client *client, const UA_NodeId objectId,
               const UA_NodeId methodId, size_t inputSize,
               const UA_Variant *input, size_t *outputSize,
               UA_Variant **output) {
    /* Set up the request */
    UA_CallRequest request;
    UA_CallRequest_init(&request);
    UA_CallMethodRequest item;
    UA_CallMethodRequest_init(&item);
    item.methodId = methodId;
    item.objectId = objectId;
    item.inputArguments = (void*)(uintptr_t)input; // cast const...
    item.inputArgumentsSize = inputSize;
    request.methodsToCall = &item;
    request.methodsToCallSize = 1;

    /* Call the service */
    UA_CallResponse response = UA_Client_Service_call(client, request);
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD) {
        if(response.resultsSize == 1)
            retval = response.results[0].statusCode;
        else
            retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
    }
    if(retval != UA_STATUSCODE_GOOD) {
        UA_CallResponse_deleteMembers(&response);
        return retval;
    }

    /* Move the output arguments */
    if(output != NULL && outputSize != NULL) {
        *output = response.results[0].outputArguments;
        *outputSize = response.results[0].outputArgumentsSize;
        response.results[0].outputArguments = NULL;
        response.results[0].outputArgumentsSize = 0;
    }
    UA_CallResponse_deleteMembers(&response);
    return retval;
}